

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchmittTrigger.cpp
# Opt level: O2

void __thiscall
iDynTree::SchmittTrigger::updateDevice(SchmittTrigger *this,double currentTime,double rawValue)

{
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  
  if (this->m_previousTime <= 0.0 && this->m_previousTime != 0.0) {
    dVar3 = 0.0;
    if (currentTime <= 0.0) {
      dVar3 = currentTime;
    }
    this->m_previousTime = dVar3;
  }
  if (this->m_verbose == 0) {
    this->m_rawValue = rawValue;
  }
  else {
    std::operator<<((ostream *)&std::cout,"SchmittTrigger: Time:: ");
    poVar1 = std::ostream::_M_insert<double>(currentTime);
    std::endl<char,std::char_traits<char>>(poVar1);
    this->m_rawValue = rawValue;
    if (this->m_verbose != 0) {
      std::operator<<((ostream *)&std::cout,"SchmittTrigger: Value:: ");
      poVar1 = std::ostream::_M_insert<double>(this->m_rawValue);
      std::endl<char,std::char_traits<char>>(poVar1);
      if (this->m_verbose != 0) {
        std::operator<<((ostream *)&std::cout,"SchmittTrigger: Timer:: ");
        poVar1 = std::ostream::_M_insert<double>(this->m_timer);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
  }
  if (this->m_currentState == false) {
    if (this->m_highValueThreshold <= this->m_rawValue) {
      dVar3 = this->m_timer;
      if (dVar3 < this->m_stableONTime || dVar3 == this->m_stableONTime) {
        this->m_timer = dVar3 + (currentTime - this->m_previousTime);
        if (this->m_verbose == 0) goto LAB_001c8bc3;
        pcVar2 = "SchmittTrigger: I\'m low and waiting ";
      }
      else {
        this->m_currentState = true;
        if (this->m_verbose == 0) goto LAB_001c8bc3;
        pcVar2 = "SchmittTrigger: Raising high ";
      }
    }
    else {
      this->m_timer = 0.0;
      if (this->m_verbose == 0) goto LAB_001c8bc3;
      pcVar2 = "SchmittTrigger: Stable low ";
    }
  }
  else if (this->m_rawValue <= this->m_lowValueThreshold) {
    dVar3 = this->m_timer;
    if (dVar3 < this->m_stableOFFTime || dVar3 == this->m_stableOFFTime) {
      this->m_timer = dVar3 + (currentTime - this->m_previousTime);
      if (this->m_verbose == 0) goto LAB_001c8bc3;
      pcVar2 = "SchmittTrigger: I\'m high and waiting ";
    }
    else {
      this->m_currentState = false;
      if (this->m_verbose == 0) goto LAB_001c8bc3;
      pcVar2 = "SchmittTrigger: Falling low ";
    }
  }
  else {
    this->m_timer = 0.0;
    if (this->m_verbose == 0) goto LAB_001c8bc3;
    pcVar2 = "SchmittTrigger: Stable high ";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_001c8bc3:
  this->m_previousTime = currentTime;
  return;
}

Assistant:

void SchmittTrigger::updateDevice(double currentTime, double rawValue)
{
    if (m_previousTime < 0)
    {
        if (currentTime > 0)
        {
            m_previousTime = 0;
        }
        else
        {
            m_previousTime = currentTime;
        }   
    }
    if (m_verbose) std::cout << "SchmittTrigger: Time:: " << currentTime << std::endl;
    m_rawValue = rawValue;
    
    if (m_verbose) std::cout << "SchmittTrigger: Value:: " << m_rawValue << std::endl;
    if (m_verbose) std::cout << "SchmittTrigger: Timer:: " << m_timer << std::endl;
    
    if (m_currentState == false)
    {   
        // Check for transition - if valid over a timeframe, then switch
        if (m_rawValue >= m_highValueThreshold)
        {               
            if (m_timer > m_stableONTime)
            {
                // rise to high
                m_currentState = true;
                if (m_verbose) std::cout << "SchmittTrigger: Raising high "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm low and waiting "  << std::endl;
            }            
        }
        else
        {
            // stable low - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable low "  << std::endl;
        }
    }
    else
    {
        // check for transition - if valid over a timeframe, then switch
        if (m_rawValue <= m_lowValueThreshold)
        {
            if (m_timer > m_stableOFFTime)
            {
                // fall to low
                m_currentState = false;
                if (m_verbose) std::cout << "SchmittTrigger: Falling low "  << std::endl;
            }
            else
            {
                // wait for timer
                m_timer += (currentTime - m_previousTime);
                if (m_verbose) std::cout << "SchmittTrigger: I'm high and waiting "  << std::endl;
            }
        }
        else
        {
            // stable high - reset timer
            m_timer = 0;
            if (m_verbose) std::cout << "SchmittTrigger: Stable high "  << std::endl;
        }
    }
    m_previousTime = currentTime;
}